

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O0

void __thiscall
webrtc::SinusoidalLinearChirpSource::SinusoidalLinearChirpSource
          (SinusoidalLinearChirpSource *this,int sample_rate,size_t samples,double max_frequency,
          double delay_samples)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  double duration;
  double delay_samples_local;
  double max_frequency_local;
  size_t samples_local;
  int sample_rate_local;
  SinusoidalLinearChirpSource *this_local;
  
  SincResamplerCallback::SincResamplerCallback(&this->super_SincResamplerCallback);
  (this->super_SincResamplerCallback)._vptr_SincResamplerCallback =
       (_func_int **)&PTR__SinusoidalLinearChirpSource_002fb8b8;
  this->sample_rate_ = sample_rate;
  this->total_samples_ = samples;
  this->max_frequency_ = max_frequency;
  this->current_index_ = 0;
  this->delay_samples_ = delay_samples;
  sVar1 = this->total_samples_;
  auVar2._8_4_ = (int)(sVar1 >> 0x20);
  auVar2._0_8_ = sVar1;
  auVar2._12_4_ = 0x45300000;
  this->k_ = (this->max_frequency_ - 5.0) /
             (((auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
             (double)this->sample_rate_);
  return;
}

Assistant:

SinusoidalLinearChirpSource::SinusoidalLinearChirpSource(int sample_rate,
                                                         size_t samples,
                                                         double max_frequency,
                                                         double delay_samples)
    : sample_rate_(sample_rate),
      total_samples_(samples),
      max_frequency_(max_frequency),
      current_index_(0),
      delay_samples_(delay_samples) {
  // Chirp rate.
  double duration = static_cast<double>(total_samples_) / sample_rate_;
  k_ = (max_frequency_ - kMinFrequency) / duration;
}